

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GetCrossFileReferencesForFile
          (FileGenerator *this,FileDescriptor *file,CrossFileReferences *refs)

{
  bool bVar1;
  int i;
  int index;
  long lVar2;
  _Insert_base<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *this_00;
  long lVar3;
  FileDescriptor *dep;
  anon_class_16_2_3fe543fb local_40;
  
  lVar3 = 0;
  local_40.this = this;
  local_40.refs = refs;
  for (lVar2 = 0; lVar2 < *(int *)(file + 0x2c); lVar2 = lVar2 + 1) {
    ForEachField<google::protobuf::compiler::cpp::FileGenerator::GetCrossFileReferencesForFile(google::protobuf::FileDescriptor_const*,google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences*)::__0>
              ((Descriptor *)(*(long *)(file + 0x58) + lVar3),&local_40);
    lVar3 = lVar3 + 0x88;
  }
  lVar3 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(file + 0x3c); lVar2 = lVar2 + 1) {
    GetCrossFileReferencesForFile::anon_class_16_2_3fe543fb::operator()
              (&local_40,(FieldDescriptor *)(*(long *)(file + 0x70) + lVar3));
    lVar3 = lVar3 + 0x48;
  }
  bVar1 = HasDescriptorMethods(file,&this->options_);
  if (bVar1) {
    for (index = 0; index < *(int *)(file + 0x20); index = index + 1) {
      local_40.this = (FileGenerator *)FileDescriptor::dependency(file,index);
      bVar1 = IsDepWeak(this,(FileDescriptor *)local_40.this);
      this_00 = (_Insert_base<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&refs->strong_reflection_files;
      if (bVar1) {
        this_00 = (_Insert_base<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&refs->weak_reflection_files;
      }
      std::__detail::
      _Insert_base<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Identity,_std::equal_to<const_google::protobuf::FileDescriptor_*>,_std::hash<const_google::protobuf::FileDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::insert(this_00,(value_type *)&local_40);
    }
  }
  return;
}

Assistant:

void FileGenerator::GetCrossFileReferencesForFile(const FileDescriptor* file,
                                                  CrossFileReferences* refs) {
  ForEachField(file, [this, refs](const FieldDescriptor* field) {
    GetCrossFileReferencesForField(field, refs);
  });

  if (!HasDescriptorMethods(file, options_)) return;

  for (int i = 0; i < file->dependency_count(); i++) {
    const FileDescriptor* dep = file->dependency(i);
    if (IsDepWeak(dep)) {
      refs->weak_reflection_files.insert(dep);
    } else {
      refs->strong_reflection_files.insert(dep);
    }
  }
}